

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O2

UBool icu_63::TimeZone::parseCustomID
                (UnicodeString *id,int32_t *sign,int32_t *hour,int32_t *min,int32_t *sec)

{
  short sVar1;
  int32_t iVar2;
  UBool UVar3;
  char16_t cVar4;
  NumberFormat *pNVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  ParsePosition pos;
  UErrorCode success;
  ConstChar16Ptr local_168;
  UChar *local_160;
  UnicodeString idUppercase;
  Formattable n;
  
  UnicodeString::UnicodeString(&idUppercase,id);
  Locale::Locale((Locale *)&n,"",(char *)0x0,(char *)0x0,(char *)0x0);
  UnicodeString::toUpper(&idUppercase,(Locale *)&n);
  Locale::~Locale((Locale *)&n);
  sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar6 = (id->fUnion).fFields.fLength;
  }
  else {
    iVar6 = (int)sVar1 >> 5;
  }
  if (3 < iVar6) {
    local_168.p_ = L"GMT";
    UVar3 = UnicodeString::startsWith(&idUppercase,&local_168,3);
    local_160 = local_168.p_;
    if (UVar3 != '\0') {
      pos.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003ce098;
      pos.index = 3;
      pos.errorIndex = -1;
      *sign = 1;
      *hour = 0;
      *min = 0;
      *sec = 0;
      cVar4 = UnicodeString::doCharAt(id,3);
      if (cVar4 == L'-') {
        *sign = -1;
LAB_002011db:
        pos.index = pos.index + 1;
        success = U_ZERO_ERROR;
        pNVar5 = NumberFormat::createInstance(&success);
        if (U_ZERO_ERROR < success) goto LAB_002011f3;
        (*(pNVar5->super_Format).super_UObject._vptr_UObject[0x17])(pNVar5,1);
        iVar2 = pos.index;
        Formattable::Formattable(&n,-99999);
        (*(pNVar5->super_Format).super_UObject._vptr_UObject[0x14])(pNVar5,id,&n,&pos);
        iVar6 = pos.index - iVar2;
        if (iVar6 == 0) {
LAB_00201240:
          (*(pNVar5->super_Format).super_UObject._vptr_UObject[1])(pNVar5);
          bVar8 = false;
        }
        else {
          *hour = n.fValue.fInt64._0_4_;
          sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar7 = (id->fUnion).fFields.fLength;
          }
          else {
            iVar7 = (int)sVar1 >> 5;
          }
          if (iVar7 <= pos.index) {
            if (iVar6 - 1U < 6) {
              if (iVar6 - 5U < 2) {
                *sec = (int)n.fValue.fInt64._0_4_ % 100;
                *min = (int32_t)((long)((ulong)(uint)((int)((long)*hour / 100) >> 0x1f) << 0x20 |
                                       (long)*hour / 100 & 0xffffffffU) % 100);
                iVar6 = *hour;
                iVar7 = 10000;
              }
              else {
                if (1 < iVar6 - 3U) goto LAB_00201360;
                iVar7 = 100;
                *min = (int)n.fValue.fInt64._0_4_ % 100;
                iVar6 = *hour;
              }
              *hour = iVar6 / iVar7;
              goto LAB_00201360;
            }
            goto LAB_00201240;
          }
          if (2 < iVar6) goto LAB_00201240;
          cVar4 = UnicodeString::doCharAt(id,pos.index);
          if (cVar4 != L':') goto LAB_00201240;
          iVar6 = pos.index + 1;
          pos.index = iVar6;
          Formattable::setLong(&n,-99999);
          (*(pNVar5->super_Format).super_UObject._vptr_UObject[0x14])(pNVar5,id,&n,&pos);
          if (pos.index - iVar6 != 2) goto LAB_00201240;
          *min = n.fValue.fInt64._0_4_;
          sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            iVar6 = (id->fUnion).fFields.fLength;
          }
          else {
            iVar6 = (int)sVar1 >> 5;
          }
          if (pos.index < iVar6) {
            cVar4 = UnicodeString::doCharAt(id,pos.index);
            if (cVar4 == L':') {
              iVar6 = pos.index + 1;
              pos.index = iVar6;
              Formattable::setLong(&n,-99999);
              (*(pNVar5->super_Format).super_UObject._vptr_UObject[0x14])(pNVar5,id,&n,&pos);
              sVar1 = (id->fUnion).fStackFields.fLengthAndFlags;
              if (sVar1 < 0) {
                iVar7 = (id->fUnion).fFields.fLength;
              }
              else {
                iVar7 = (int)sVar1 >> 5;
              }
              if (pos.index - iVar6 == 2 && iVar7 == pos.index) {
                *sec = n.fValue.fInt64._0_4_;
                goto LAB_00201360;
              }
            }
            goto LAB_00201240;
          }
LAB_00201360:
          (*(pNVar5->super_Format).super_UObject._vptr_UObject[1])(pNVar5);
          bVar8 = *sec < 0x3c && (*min < 0x3c && *hour < 0x18);
        }
        Formattable::~Formattable(&n);
      }
      else {
        cVar4 = UnicodeString::doCharAt(id,pos.index);
        if (cVar4 == L'+') goto LAB_002011db;
LAB_002011f3:
        bVar8 = false;
      }
      ParsePosition::~ParsePosition(&pos);
      goto LAB_00201260;
    }
  }
  bVar8 = false;
LAB_00201260:
  UnicodeString::~UnicodeString(&idUppercase);
  return bVar8;
}

Assistant:

UBool
TimeZone::parseCustomID(const UnicodeString& id, int32_t& sign,
                        int32_t& hour, int32_t& min, int32_t& sec) {
    static const int32_t         kParseFailed = -99999;

    NumberFormat* numberFormat = 0;
    UnicodeString idUppercase = id;
    idUppercase.toUpper("");

    if (id.length() > GMT_ID_LENGTH &&
        idUppercase.startsWith(GMT_ID, GMT_ID_LENGTH))
    {
        ParsePosition pos(GMT_ID_LENGTH);
        sign = 1;
        hour = 0;
        min = 0;
        sec = 0;

        if (id[pos.getIndex()] == MINUS /*'-'*/) {
            sign = -1;
        } else if (id[pos.getIndex()] != PLUS /*'+'*/) {
            return FALSE;
        }
        pos.setIndex(pos.getIndex() + 1);

        UErrorCode success = U_ZERO_ERROR;
        numberFormat = NumberFormat::createInstance(success);
        if(U_FAILURE(success)){
            return FALSE;
        }
        numberFormat->setParseIntegerOnly(TRUE);
        //numberFormat->setLenient(TRUE); // TODO: May need to set this, depends on latest timezone parsing

        // Look for either hh:mm, hhmm, or hh
        int32_t start = pos.getIndex();
        Formattable n(kParseFailed);
        numberFormat->parse(id, n, pos);
        if (pos.getIndex() == start) {
            delete numberFormat;
            return FALSE;
        }
        hour = n.getLong();

        if (pos.getIndex() < id.length()) {
            if (pos.getIndex() - start > 2
                || id[pos.getIndex()] != COLON) {
                delete numberFormat;
                return FALSE;
            }
            // hh:mm
            pos.setIndex(pos.getIndex() + 1);
            int32_t oldPos = pos.getIndex();
            n.setLong(kParseFailed);
            numberFormat->parse(id, n, pos);
            if ((pos.getIndex() - oldPos) != 2) {
                // must be 2 digits
                delete numberFormat;
                return FALSE;
            }
            min = n.getLong();
            if (pos.getIndex() < id.length()) {
                if (id[pos.getIndex()] != COLON) {
                    delete numberFormat;
                    return FALSE;
                }
                // [:ss]
                pos.setIndex(pos.getIndex() + 1);
                oldPos = pos.getIndex();
                n.setLong(kParseFailed);
                numberFormat->parse(id, n, pos);
                if (pos.getIndex() != id.length()
                        || (pos.getIndex() - oldPos) != 2) {
                    delete numberFormat;
                    return FALSE;
                }
                sec = n.getLong();
            }
        } else {
            // Supported formats are below -
            //
            // HHmmss
            // Hmmss
            // HHmm
            // Hmm
            // HH
            // H

            int32_t length = pos.getIndex() - start;
            if (length <= 0 || 6 < length) {
                // invalid length
                delete numberFormat;
                return FALSE;
            }
            switch (length) {
                case 1:
                case 2:
                    // already set to hour
                    break;
                case 3:
                case 4:
                    min = hour % 100;
                    hour /= 100;
                    break;
                case 5:
                case 6:
                    sec = hour % 100;
                    min = (hour/100) % 100;
                    hour /= 10000;
                    break;
            }
        }

        delete numberFormat;

        if (hour > kMAX_CUSTOM_HOUR || min > kMAX_CUSTOM_MIN || sec > kMAX_CUSTOM_SEC) {
            return FALSE;
        }
        return TRUE;
    }
    return FALSE;
}